

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

Block * __thiscall
moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
requisition_block<(moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
          (ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits> *this)

{
  Block *block;
  ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this_local;
  
  this_local = (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *)
               ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
               try_get_block_from_initial_pool
                         ((ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *
                          )this);
  if ((this_local == (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *)0x0)
     && (this_local = (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *)
                      ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
                      try_get_block_from_free_list
                                ((ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>
                                  *)this),
        this_local == (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *)0x0
        )) {
    this_local = (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *)
                 create<moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::Block>
                           ();
  }
  return (Block *)this_local;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}
		
		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}
		
		if (canAlloc == CanAlloc) {
			return create<Block>();
		}
		
		return nullptr;
	}